

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joynu.c
# Opt level: O2

_Bool al_install_joystick(void)

{
  _func_ALLEGRO_JOYSTICK_DRIVER_ptr *p_Var1;
  _Bool _Var2;
  ALLEGRO_SYSTEM *pAVar3;
  ALLEGRO_JOYSTICK_DRIVER *pAVar4;
  
  _Var2 = true;
  if (new_joystick_driver == (ALLEGRO_JOYSTICK_DRIVER *)0x0) {
    pAVar3 = al_get_system_driver();
    p_Var1 = pAVar3->vt->get_joystick_driver;
    if (p_Var1 != (_func_ALLEGRO_JOYSTICK_DRIVER_ptr *)0x0) {
      pAVar4 = (*p_Var1)();
      _al_event_source_init(&es);
      if ((pAVar4 != (ALLEGRO_JOYSTICK_DRIVER *)0x0) && (_Var2 = (*pAVar4->init_joystick)(), _Var2))
      {
        new_joystick_driver = pAVar4;
        _al_add_exit_func(al_uninstall_joystick,"al_uninstall_joystick");
        return true;
      }
      _al_event_source_free(&es);
    }
    _Var2 = false;
  }
  return _Var2;
}

Assistant:

bool al_install_joystick(void)
{
   ALLEGRO_SYSTEM *sysdrv;
   ALLEGRO_JOYSTICK_DRIVER *joydrv;

   if (new_joystick_driver)
      return true;

   sysdrv = al_get_system_driver();
   ASSERT(sysdrv);

   /* Currently every platform only has at most one joystick driver. */
   if (sysdrv->vt->get_joystick_driver) {
      joydrv = sysdrv->vt->get_joystick_driver();
      /* Avoid race condition in case the joystick driver generates an
       * event right after ->init_joystick.
       */
      _al_event_source_init(&es);
      if (joydrv && joydrv->init_joystick()) {
         new_joystick_driver = joydrv;
         _al_add_exit_func(al_uninstall_joystick, "al_uninstall_joystick");
         return true;
      }
      _al_event_source_free(&es);
   }

   return false;
}